

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O3

uint32_t asmjit::v1_14::CodeHolder_hashNameAndGetSize(char *name,size_t *nameSize)

{
  uint32_t uVar1;
  size_t sVar2;
  byte bVar3;
  size_t i;
  size_t sVar4;
  
  sVar2 = *nameSize;
  if (sVar2 == 0xffffffffffffffff) {
    bVar3 = *name;
    if (bVar3 == 0) {
      sVar2 = 0;
      uVar1 = 0;
    }
    else {
      uVar1 = 0;
      sVar2 = 0;
      do {
        uVar1 = uVar1 * 0x1003f + (uint)bVar3;
        bVar3 = name[sVar2 + 1];
        sVar2 = sVar2 + 1;
      } while (bVar3 != 0);
    }
    *nameSize = sVar2;
    return uVar1;
  }
  uVar1 = 0;
  if (sVar2 != 0) {
    sVar4 = 0;
    uVar1 = 0;
    do {
      if (name[sVar4] == 0) {
        return 0x11;
      }
      uVar1 = uVar1 * 0x1003f + (uint)(byte)name[sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar2 != sVar4);
  }
  return uVar1;
}

Assistant:

static uint32_t CodeHolder_hashNameAndGetSize(const char* name, size_t& nameSize) noexcept {
  uint32_t hashCode = 0;
  if (nameSize == SIZE_MAX) {
    size_t i = 0;
    for (;;) {
      uint8_t c = uint8_t(name[i]);
      if (!c) break;
      hashCode = Support::hashRound(hashCode, c);
      i++;
    }
    nameSize = i;
  }
  else {
    for (size_t i = 0; i < nameSize; i++) {
      uint8_t c = uint8_t(name[i]);
      if (ASMJIT_UNLIKELY(!c)) return DebugUtils::errored(kErrorInvalidLabelName);
      hashCode = Support::hashRound(hashCode, c);
    }
  }
  return hashCode;
}